

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int ARKodeRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  int iVar1;
  ARKodeRootMem pAVar2;
  sunrealtype *psVar3;
  int *piVar4;
  ARKRootFn in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int nrt;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x31,"ARKodeRootInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (in_ESI < 0) {
    in_ESI = 0;
  }
  if (0 < in_ESI) {
    if (in_RDI->step_fullrhs == (ARKTimestepFullRHSFn)0x0) {
      arkProcessError(in_RDI,-0x16,0x3d,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,
                      "Time-stepping module missing fullrhs routine (required by requested solver configuration)."
                     );
      return -0x16;
    }
    iVar1 = arkAllocVec((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_ESI),(N_Vector)in_RDI,
                        (N_Vector *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
    if (iVar1 == 0) {
      arkProcessError(in_RDI,-0x14,0x44,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"A memory request failed.");
      return -0x14;
    }
  }
  if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
    pAVar2 = (ARKodeRootMem)malloc(0x88);
    in_RDI->root_mem = pAVar2;
    if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
      arkProcessError(in_RDI,0,0x50,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"Allocation of arkode_mem failed.");
      return -0x14;
    }
    in_RDI->root_mem->glo = (sunrealtype *)0x0;
    in_RDI->root_mem->ghi = (sunrealtype *)0x0;
    in_RDI->root_mem->grout = (sunrealtype *)0x0;
    in_RDI->root_mem->iroots = (int *)0x0;
    in_RDI->root_mem->rootdir = (int *)0x0;
    in_RDI->root_mem->gfun = (ARKRootFn)0x0;
    in_RDI->root_mem->nrtfn = 0;
    in_RDI->root_mem->irfnd = 0;
    in_RDI->root_mem->gactive = (int *)0x0;
    in_RDI->root_mem->mxgnull = 1;
    in_RDI->root_mem->root_data = in_RDI->user_data;
    in_RDI->lrw = in_RDI->lrw + 5;
    in_RDI->liw = in_RDI->liw + 0xc;
  }
  if ((in_ESI != in_RDI->root_mem->nrtfn) && (0 < in_RDI->root_mem->nrtfn)) {
    free(in_RDI->root_mem->glo);
    in_RDI->root_mem->glo = (sunrealtype *)0x0;
    free(in_RDI->root_mem->ghi);
    in_RDI->root_mem->ghi = (sunrealtype *)0x0;
    free(in_RDI->root_mem->grout);
    in_RDI->root_mem->grout = (sunrealtype *)0x0;
    free(in_RDI->root_mem->iroots);
    in_RDI->root_mem->iroots = (int *)0x0;
    free(in_RDI->root_mem->rootdir);
    in_RDI->root_mem->rootdir = (int *)0x0;
    free(in_RDI->root_mem->gactive);
    in_RDI->root_mem->gactive = (int *)0x0;
    in_RDI->lrw = in_RDI->lrw - (long)(in_RDI->root_mem->nrtfn * 3);
    in_RDI->liw = in_RDI->liw - (long)(in_RDI->root_mem->nrtfn * 3);
  }
  if (in_ESI == 0) {
    in_RDI->root_mem->nrtfn = 0;
    in_RDI->root_mem->gfun = (ARKRootFn)0x0;
    local_4 = 0;
  }
  else if (in_ESI == in_RDI->root_mem->nrtfn) {
    if (in_RDX == in_RDI->root_mem->gfun) {
      local_4 = 0;
    }
    else if (in_RDX == (ARKRootFn)0x0) {
      free(in_RDI->root_mem->glo);
      in_RDI->root_mem->glo = (sunrealtype *)0x0;
      free(in_RDI->root_mem->ghi);
      in_RDI->root_mem->ghi = (sunrealtype *)0x0;
      free(in_RDI->root_mem->grout);
      in_RDI->root_mem->grout = (sunrealtype *)0x0;
      free(in_RDI->root_mem->iroots);
      in_RDI->root_mem->iroots = (int *)0x0;
      free(in_RDI->root_mem->rootdir);
      in_RDI->root_mem->rootdir = (int *)0x0;
      free(in_RDI->root_mem->gactive);
      in_RDI->root_mem->gactive = (int *)0x0;
      in_RDI->lrw = in_RDI->lrw - (long)(in_ESI * 3);
      in_RDI->liw = in_RDI->liw - (long)(in_ESI * 3);
      arkProcessError(in_RDI,-0x16,0x9e,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"g = NULL illegal.");
      local_4 = -0x16;
    }
    else {
      in_RDI->root_mem->gfun = in_RDX;
      local_4 = 0;
    }
  }
  else {
    in_RDI->root_mem->nrtfn = in_ESI;
    if (in_RDX == (ARKRootFn)0x0) {
      arkProcessError(in_RDI,-0x16,0xaf,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"g = NULL illegal.");
      local_4 = -0x16;
    }
    else {
      in_RDI->root_mem->gfun = in_RDX;
      in_RDI->root_mem->glo = (sunrealtype *)0x0;
      psVar3 = (sunrealtype *)malloc((long)in_ESI << 3);
      in_RDI->root_mem->glo = psVar3;
      if (in_RDI->root_mem->glo == (sunrealtype *)0x0) {
        arkProcessError(in_RDI,-0x14,0xba,"ARKodeRootInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                        ,"A memory request failed.");
        local_4 = -0x14;
      }
      else {
        in_RDI->root_mem->ghi = (sunrealtype *)0x0;
        psVar3 = (sunrealtype *)malloc((long)in_ESI << 3);
        in_RDI->root_mem->ghi = psVar3;
        if (in_RDI->root_mem->ghi == (sunrealtype *)0x0) {
          free(in_RDI->root_mem->glo);
          in_RDI->root_mem->glo = (sunrealtype *)0x0;
          arkProcessError(in_RDI,-0x14,0xc4,"ARKodeRootInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                          ,"A memory request failed.");
          local_4 = -0x14;
        }
        else {
          in_RDI->root_mem->grout = (sunrealtype *)0x0;
          psVar3 = (sunrealtype *)malloc((long)in_ESI << 3);
          in_RDI->root_mem->grout = psVar3;
          if (in_RDI->root_mem->grout == (sunrealtype *)0x0) {
            free(in_RDI->root_mem->glo);
            in_RDI->root_mem->glo = (sunrealtype *)0x0;
            free(in_RDI->root_mem->ghi);
            in_RDI->root_mem->ghi = (sunrealtype *)0x0;
            arkProcessError(in_RDI,-0x14,0xd0,"ARKodeRootInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                            ,"A memory request failed.");
            local_4 = -0x14;
          }
          else {
            in_RDI->root_mem->iroots = (int *)0x0;
            piVar4 = (int *)malloc((long)in_ESI << 2);
            in_RDI->root_mem->iroots = piVar4;
            if (in_RDI->root_mem->iroots == (int *)0x0) {
              free(in_RDI->root_mem->glo);
              in_RDI->root_mem->glo = (sunrealtype *)0x0;
              free(in_RDI->root_mem->ghi);
              in_RDI->root_mem->ghi = (sunrealtype *)0x0;
              free(in_RDI->root_mem->grout);
              in_RDI->root_mem->grout = (sunrealtype *)0x0;
              arkProcessError(in_RDI,-0x14,0xde,"ARKodeRootInit",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                              ,"A memory request failed.");
              local_4 = -0x14;
            }
            else {
              in_RDI->root_mem->rootdir = (int *)0x0;
              piVar4 = (int *)malloc((long)in_ESI << 2);
              in_RDI->root_mem->rootdir = piVar4;
              if (in_RDI->root_mem->rootdir == (int *)0x0) {
                free(in_RDI->root_mem->glo);
                in_RDI->root_mem->glo = (sunrealtype *)0x0;
                free(in_RDI->root_mem->ghi);
                in_RDI->root_mem->ghi = (sunrealtype *)0x0;
                free(in_RDI->root_mem->grout);
                in_RDI->root_mem->grout = (sunrealtype *)0x0;
                free(in_RDI->root_mem->iroots);
                in_RDI->root_mem->iroots = (int *)0x0;
                arkProcessError(in_RDI,-0x14,0xee,"ARKodeRootInit",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                                ,"A memory request failed.");
                local_4 = -0x14;
              }
              else {
                in_RDI->root_mem->gactive = (int *)0x0;
                piVar4 = (int *)malloc((long)in_ESI << 2);
                in_RDI->root_mem->gactive = piVar4;
                if (in_RDI->root_mem->gactive == (int *)0x0) {
                  free(in_RDI->root_mem->glo);
                  in_RDI->root_mem->glo = (sunrealtype *)0x0;
                  free(in_RDI->root_mem->ghi);
                  in_RDI->root_mem->ghi = (sunrealtype *)0x0;
                  free(in_RDI->root_mem->grout);
                  in_RDI->root_mem->grout = (sunrealtype *)0x0;
                  free(in_RDI->root_mem->iroots);
                  in_RDI->root_mem->iroots = (int *)0x0;
                  free(in_RDI->root_mem->rootdir);
                  in_RDI->root_mem->rootdir = (int *)0x0;
                  arkProcessError(in_RDI,-0x14,0x101,"ARKodeRootInit",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                                  ,"A memory request failed.");
                  local_4 = -0x14;
                }
                else {
                  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
                    in_RDI->root_mem->rootdir[iVar1] = 0;
                  }
                  for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
                    in_RDI->root_mem->gactive[iVar1] = 1;
                  }
                  in_RDI->lrw = (long)(in_ESI * 3) + in_RDI->lrw;
                  in_RDI->liw = (long)(in_ESI * 3) + in_RDI->liw;
                  local_4 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeRootInit(void* arkode_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  nrt     = (nrtfn < 0) ? 0 : nrtfn;

  /* Ensure that stepper provides fullrhs function */
  if (nrt > 0)
  {
    if (!(ark_mem->step_fullrhs))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL)
  {
    ark_mem->root_mem = (ARKodeRootMem)malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL)
    {
      arkProcessError(ark_mem, 0, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning ARKodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0))
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive);
    ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If ARKodeRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0)
  {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun  = NULL;
    return (ARK_SUCCESS);
  }

  /* If rerunning ARKodeRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn)
  {
    if (g != ark_mem->root_mem->gfun)
    {
      if (g == NULL)
      {
        free(ark_mem->root_mem->glo);
        ark_mem->root_mem->glo = NULL;
        free(ark_mem->root_mem->ghi);
        ark_mem->root_mem->ghi = NULL;
        free(ark_mem->root_mem->grout);
        ark_mem->root_mem->grout = NULL;
        free(ark_mem->root_mem->iroots);
        ark_mem->root_mem->iroots = NULL;
        free(ark_mem->root_mem->rootdir);
        ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive);
        ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3 * nrt;
        ark_mem->liw -= 3 * nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_NULL_G);
        return (ARK_ILL_INPUT);
      }
      else
      {
        ark_mem->root_mem->gfun = g;
        return (ARK_SUCCESS);
      }
    }
    else { return (ARK_SUCCESS); }
  }

  /* Set variable values in ARKODE memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_G);
    return (ARK_ILL_INPUT);
  }
  else { ark_mem->root_mem->gfun = g; }

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->glo == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->ghi == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->grout == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->iroots == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive =
    (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (ark_mem->root_mem->gactive == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->gactive[i] = SUNTRUE; }

  ark_mem->lrw += 3 * nrt;
  ark_mem->liw += 3 * nrt;

  return (ARK_SUCCESS);
}